

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# blend_a64_mask_avx2.c
# Opt level: O0

void lowbd_blend_a64_d16_mask_subw0_subh1_w16_avx2
               (uint8_t *dst,uint32_t dst_stride,CONV_BUF_TYPE *src0,uint32_t src0_stride,
               CONV_BUF_TYPE *src1,uint32_t src1_stride,uint8_t *mask,uint32_t mask_stride,int h,
               int w,__m256i *round_offset,int shift)

{
  undefined1 auVar1 [32];
  uint in_ESI;
  __m256i *in_RDI;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [64];
  long in_stack_00000008;
  __m128i m_ac;
  __m128i m_i10;
  __m128i m_i00;
  int j;
  int i;
  __m128i zeros;
  __m256i v_maxval;
  int in_stack_fffffffffffffe28;
  CONV_BUF_TYPE *local_190;
  CONV_BUF_TYPE *pCStack_188;
  uint8_t *local_180;
  int local_158;
  int local_154;
  ulong uStack_148;
  undefined4 in_stack_ffffffffffffff08;
  undefined6 in_stack_ffffffffffffff18;
  undefined2 uVar5;
  
  uVar5 = 0x40;
  auVar3 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar3 = vpinsrw_avx(auVar3,0x40,2);
  auVar3 = vpinsrw_avx(auVar3,0x40,3);
  auVar3 = vpinsrw_avx(auVar3,0x40,4);
  auVar3 = vpinsrw_avx(auVar3,0x40,5);
  auVar3 = vpinsrw_avx(auVar3,0x40,6);
  vpinsrw_avx(auVar3,0x40,7);
  auVar3 = vpinsrw_avx(ZEXT216(0x40),0x40,1);
  auVar3 = vpinsrw_avx(auVar3,0x40,2);
  auVar3 = vpinsrw_avx(auVar3,0x40,3);
  auVar3 = vpinsrw_avx(auVar3,0x40,4);
  auVar3 = vpinsrw_avx(auVar3,0x40,5);
  auVar3 = vpinsrw_avx(auVar3,0x40,6);
  vpinsrw_avx(auVar3,0x40,7);
  auVar4 = ZEXT1664(ZEXT816(0) << 0x20);
  for (local_154 = 0; local_154 < (int)mask_stride; local_154 = local_154 + 1) {
    for (local_158 = 0; local_158 < h; local_158 = local_158 + 0x10) {
      auVar2 = auVar4._0_16_;
      xx_loadu_128((void *)(in_stack_00000008 + local_158));
      auVar3 = auVar2;
      xx_loadu_128((void *)(in_stack_00000008 + ((ulong)mask & 0xffffffff) + (long)local_158));
      local_180 = auVar3._0_8_;
      auVar3 = vpaddusb_avx(auVar2,auVar3);
      uStack_148 = SUB168(ZEXT816(0),4);
      auVar2._8_8_ = 0;
      auVar2._0_8_ = uStack_148;
      auVar3 = vpavgb_avx(auVar3,auVar2 << 0x40);
      local_190 = auVar3._0_8_;
      pCStack_188 = auVar3._8_8_;
      auVar1 = vpmovzxbw_avx2(auVar3);
      auVar4 = ZEXT1664(auVar1._0_16_);
      blend_a64_d16_mask_w16_avx2
                (local_180,pCStack_188,local_190,
                 (__m256i *)CONCAT26(uVar5,in_stack_ffffffffffffff18),in_RDI,
                 (__m256i *)CONCAT44(in_ESI,in_stack_ffffffffffffff08),in_stack_fffffffffffffe28);
    }
    in_stack_00000008 = in_stack_00000008 + (ulong)(uint)((int)mask << 1);
    in_RDI = (__m256i *)((long)*in_RDI + (ulong)in_ESI);
  }
  return;
}

Assistant:

static inline void lowbd_blend_a64_d16_mask_subw0_subh1_w16_avx2(
    uint8_t *dst, uint32_t dst_stride, const CONV_BUF_TYPE *src0,
    uint32_t src0_stride, const CONV_BUF_TYPE *src1, uint32_t src1_stride,
    const uint8_t *mask, uint32_t mask_stride, int h, int w,
    const __m256i *round_offset, int shift) {
  const __m256i v_maxval = _mm256_set1_epi16(AOM_BLEND_A64_MAX_ALPHA);
  const __m128i zeros = _mm_setzero_si128();
  for (int i = 0; i < h; ++i) {
    for (int j = 0; j < w; j += 16) {
      const __m128i m_i00 = xx_loadu_128(mask + j);
      const __m128i m_i10 = xx_loadu_128(mask + mask_stride + j);

      const __m128i m_ac = _mm_avg_epu8(_mm_adds_epu8(m_i00, m_i10), zeros);
      const __m256i m0 = _mm256_cvtepu8_epi16(m_ac);

      blend_a64_d16_mask_w16_avx2(dst + j, src0 + j, src1 + j, &m0,
                                  round_offset, &v_maxval, shift);
    }
    mask += mask_stride << 1;
    dst += dst_stride;
    src0 += src0_stride;
    src1 += src1_stride;
  }
}